

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O3

Var Js::JsBuiltInEngineInterfaceExtensionObject::EntryJsBuiltIn_Internal_ArraySpeciesCreate
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  int64 iVar5;
  JavascriptArray *aValue;
  JavascriptCopyOnAccessNativeIntArray *this;
  uint in_stack_00000010;
  Var in_stack_00000020;
  Var in_stack_00000028;
  undefined8 uStack_28;
  bool isBuiltinArrayCtor;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  uStack_28 = in_RAX;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x1d5,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d2b49e;
    *puVar4 = 0;
  }
  if ((callInfo._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x1d5,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00d2b49e;
    *puVar4 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)callInfo & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x1d5,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00d2b49e;
    *puVar4 = 0;
  }
  else {
    if ((int)((ulong)callInfo & 0xffffff) == 3) goto LAB_00d2b418;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  *puVar4 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                              ,0x1d6,"(args.Info.Count == 3)","args.Info.Count == 3");
  if (!bVar3) {
LAB_00d2b49e:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar4 = 0;
LAB_00d2b418:
  iVar5 = JavascriptConversion::ToLength(in_stack_00000028,pSVar1);
  if (iVar5 < 0x100000000) {
    uStack_28 = CONCAT17(1,(undefined7)uStack_28);
    aValue = (JavascriptArray *)
             JavascriptArray::ArraySpeciesCreate<unsigned_int>
                       (in_stack_00000020,(uint)iVar5,pSVar1,(bool *)0x0,(bool *)0x0,
                        (bool *)((long)&uStack_28 + 7));
    if (aValue == (JavascriptArray *)0x0) {
      aValue = JavascriptLibrary::CreateArray
                         ((pSVar1->super_ScriptContextBase).javascriptLibrary,(uint)iVar5);
    }
    else {
      bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(aValue);
      if (bVar3) {
        this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(aValue);
        if (this != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
          JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
        }
      }
    }
    return aValue;
  }
  JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ec5b,(PCWSTR)0x0);
}

Assistant:

Var JsBuiltInEngineInterfaceExtensionObject::EntryJsBuiltIn_Internal_ArraySpeciesCreate(RecyclableObject *function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        AssertOrFailFast(args.Info.Count == 3);

        int64 length64 = JavascriptConversion::ToLength(args.Values[2], scriptContext);
        if (length64 > UINT_MAX)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
        }

        uint32 length = static_cast<uint32>(length64);

        bool isBuiltinArrayCtor = true;
        RecyclableObject * newObj = JavascriptArray::ArraySpeciesCreate(args.Values[1], length, scriptContext, nullptr, nullptr, &isBuiltinArrayCtor);
        nullptr;

        if (newObj == nullptr)
        {
            newObj = scriptContext->GetLibrary()->CreateArray(length);
        }
        else
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newObj);
#endif
        }

        return newObj;
    }